

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_unstable.cpp
# Opt level: O0

void merge_3way_unstable(uchar **from0,size_t n0,uchar **from1,size_t n1,uchar **from2,size_t n2,
                        uchar **result)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  undefined8 *puVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  uchar **ppuVar8;
  int cmpab_8;
  int cmpab_7;
  int cmpab_6;
  int cmpac_5;
  int cmpab_5;
  int cmpac_4;
  int cmpab_4;
  int cmpac_3;
  int cmpab_3;
  int cmpac_2;
  int cmpab_2;
  int cmpac_1;
  int cmpab_1;
  int cmpac;
  int cmpab;
  int cmp02;
  int cmp12;
  int cmp01;
  size_t n2_local;
  uchar **from2_local;
  size_t n1_local;
  uchar **from1_local;
  size_t n0_local;
  uchar **from0_local;
  
  poVar3 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"merge_3way_unstable");
  poVar3 = std::operator<<(poVar3,"(), n0=");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,n0);
  poVar3 = std::operator<<(poVar3,", n1=");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,n1);
  poVar3 = std::operator<<(poVar3,", n2=");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,n2);
  std::operator<<(poVar3,"\n");
  _cmp12 = n2;
  n2_local = (size_t)from2;
  from2_local = (uchar **)n1;
  n1_local = (size_t)from1;
  from1_local = (uchar **)n0;
  n0_local = (size_t)from0;
LAB_002f5739:
  do {
    iVar1 = cmp(*(void **)n0_local,*(void **)n1_local);
    iVar2 = cmp(*(void **)n1_local,*(void **)n2_local);
    if (iVar1 < 0) {
      if (iVar2 < 0) goto LAB_002f5821;
      if (iVar2 != 0) {
        iVar1 = cmp(*(void **)n0_local,*(void **)n2_local);
        if (iVar1 < 0) goto LAB_002f58b6;
        if (iVar1 != 0) {
LAB_002f5a72:
          do {
            puVar4 = (undefined8 *)(n2_local + 8);
            ppuVar8 = result + 1;
            *result = *(uchar **)n2_local;
            _cmp12 = _cmp12 - 1;
            result = ppuVar8;
            if (_cmp12 == 0) goto LAB_002f60af;
            iVar1 = cmp((void *)*puVar4,*(void **)n0_local);
            n2_local = (size_t)puVar4;
            if (-1 < iVar1) {
              if (iVar1 != 0) {
                iVar1 = cmp((void *)*puVar4,*(void **)n1_local);
                if (iVar1 < 0) goto LAB_002f58b6;
                if (iVar1 != 0) {
LAB_002f5821:
                  do {
                    puVar4 = (undefined8 *)(n0_local + 8);
                    ppuVar8 = result + 1;
                    *result = *(uchar **)n0_local;
                    from1_local = (uchar **)((long)from1_local + -1);
                    result = ppuVar8;
                    if (from1_local == (uchar **)0x0) goto LAB_002f5f19;
                    iVar1 = cmp((void *)*puVar4,*(void **)n1_local);
                    n0_local = (size_t)puVar4;
                    if (-1 < iVar1) {
                      if (iVar1 != 0) {
                        iVar1 = cmp((void *)*puVar4,*(void **)n2_local);
joined_r0x002f580a:
                        result = ppuVar8;
                        if (iVar1 < 0) goto LAB_002f594b;
                        if (iVar1 != 0) {
                          while( true ) {
                            puVar4 = (undefined8 *)(n1_local + 8);
                            ppuVar8 = result + 1;
                            *result = *(uchar **)n1_local;
                            from2_local = (uchar **)((long)from2_local + -1);
                            result = ppuVar8;
                            if (from2_local == (uchar **)0x0) break;
                            iVar1 = cmp((void *)*puVar4,*(void **)n2_local);
                            n1_local = (size_t)puVar4;
                            if (-1 < iVar1) {
                              if (iVar1 == 0) goto LAB_002f5c96;
                              iVar1 = cmp((void *)*puVar4,*(void **)n0_local);
                              if (-1 < iVar1) {
                                if (iVar1 != 0) goto LAB_002f5a72;
                                goto LAB_002f5df1;
                              }
LAB_002f5b07:
                              while( true ) {
                                do {
                                  puVar4 = (undefined8 *)(n2_local + 8);
                                  ppuVar8 = result + 1;
                                  *result = *(uchar **)n2_local;
                                  _cmp12 = _cmp12 - 1;
                                  result = ppuVar8;
                                  if (_cmp12 == 0) goto LAB_002f60af;
                                  iVar1 = cmp((void *)*puVar4,*(void **)n1_local);
                                  n2_local = (size_t)puVar4;
                                } while (iVar1 < 0);
                                if (iVar1 == 0) goto LAB_002f5c96;
                                iVar1 = cmp((void *)*puVar4,*(void **)n0_local);
                                if (iVar1 < 0) break;
                                if (iVar1 == 0) goto LAB_002f5d8b;
LAB_002f594b:
                                do {
                                  puVar4 = (undefined8 *)(n1_local + 8);
                                  ppuVar8 = result + 1;
                                  *result = *(uchar **)n1_local;
                                  from2_local = (uchar **)((long)from2_local + -1);
                                  result = ppuVar8;
                                  if (from2_local == (uchar **)0x0) goto LAB_002f5fe4;
                                  iVar1 = cmp((void *)*puVar4,*(void **)n0_local);
                                  n1_local = (size_t)puVar4;
                                } while (iVar1 < 0);
                                if (iVar1 == 0) goto LAB_002f5b9c;
                                iVar1 = cmp((void *)*puVar4,*(void **)n2_local);
                                if (iVar1 < 0) goto LAB_002f5821;
                                if (iVar1 == 0) goto LAB_002f5d22;
LAB_002f58b6:
                                do {
                                  puVar4 = (undefined8 *)(n0_local + 8);
                                  ppuVar8 = result + 1;
                                  *result = *(uchar **)n0_local;
                                  from1_local = (uchar **)((long)from1_local + -1);
                                  result = ppuVar8;
                                  if (from1_local == (uchar **)0x0) goto LAB_002f5f19;
                                  iVar1 = cmp((void *)*puVar4,*(void **)n2_local);
                                  n0_local = (size_t)puVar4;
                                } while (iVar1 < 0);
                                if (iVar1 == 0) goto LAB_002f5c19;
                                iVar1 = cmp((void *)*puVar4,*(void **)n1_local);
                                if (iVar1 < 0) goto LAB_002f5a72;
                                if (iVar1 == 0) goto LAB_002f5df1;
                              }
                            }
                          }
                          goto LAB_002f5fe4;
                        }
                        goto LAB_002f5d8b;
                      }
                      goto LAB_002f5b9c;
                    }
                  } while( true );
                }
                goto LAB_002f5d22;
              }
              break;
            }
          } while( true );
        }
        goto LAB_002f5c19;
      }
LAB_002f5d22:
      do {
        puVar4 = (undefined8 *)(n0_local + 8);
        ppuVar8 = result + 1;
        *result = *(uchar **)n0_local;
        from1_local = (uchar **)((long)from1_local + -1);
        result = ppuVar8;
        if (from1_local == (uchar **)0x0) goto LAB_002f5f19;
        iVar1 = cmp((void *)*puVar4,*(void **)n1_local);
        n0_local = (size_t)puVar4;
      } while (iVar1 < 0);
      if (iVar1 == 0) goto LAB_002f5e63;
LAB_002f5c96:
      ppuVar8 = result + 1;
      *result = *(uchar **)n1_local;
      sVar5 = n2_local + 8;
      result = result + 2;
      *ppuVar8 = *(uchar **)n2_local;
      from2_local = (uchar **)((long)from2_local + -1);
      _cmp12 = _cmp12 - 1;
      n2_local = sVar5;
      n1_local = n1_local + 8;
      if (from2_local != (uchar **)0x0) goto joined_r0x002f5f0d;
      break;
    }
    if (iVar1 != 0) {
      if (0 < iVar2) goto LAB_002f5b07;
      if (iVar2 != 0) {
        iVar1 = cmp(*(void **)n0_local,*(void **)n2_local);
        ppuVar8 = result;
        goto joined_r0x002f580a;
      }
      goto LAB_002f5c96;
    }
    if (-1 < iVar2) {
      if (iVar2 != 0) {
LAB_002f5df1:
        do {
          puVar4 = (undefined8 *)(n2_local + 8);
          ppuVar8 = result + 1;
          *result = *(uchar **)n2_local;
          _cmp12 = _cmp12 - 1;
          result = ppuVar8;
          if (_cmp12 == 0) goto LAB_002f60af;
          iVar1 = cmp((void *)*puVar4,*(void **)n0_local);
          n2_local = (size_t)puVar4;
        } while (iVar1 < 0);
        if (iVar1 != 0) goto LAB_002f5b9c;
      }
      goto LAB_002f5e63;
    }
LAB_002f5b9c:
    sVar5 = n0_local + 8;
    ppuVar8 = result + 1;
    *result = *(uchar **)n0_local;
    sVar6 = n1_local + 8;
    result = result + 2;
    *ppuVar8 = *(uchar **)n1_local;
    from1_local = (uchar **)((long)from1_local + -1);
    from2_local = (uchar **)((long)from2_local + -1);
    n1_local = sVar6;
    if (from1_local == (uchar **)0x0) goto LAB_002f5f19;
    n0_local = sVar5;
  } while (from2_local != (uchar **)0x0);
LAB_002f5fe4:
  if (from1_local == (uchar **)0x0) {
    if (_cmp12 != 0) {
      memcpy(result,(void *)n2_local,_cmp12 << 3);
    }
  }
  else if (_cmp12 == 0) {
    memcpy(result,(void *)n0_local,(long)from1_local << 3);
  }
  else {
    merge_2way_unstable((uchar **)n0_local,(size_t)from1_local,(uchar **)n2_local,_cmp12,result);
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"~");
  poVar3 = std::operator<<(poVar3,"merge_3way_unstable");
  std::operator<<(poVar3,"\n");
  return;
  while (iVar1 = cmp((void *)*puVar4,*(void **)n0_local), n1_local = (size_t)puVar4, iVar1 < 0) {
LAB_002f5d8b:
    puVar4 = (undefined8 *)(n1_local + 8);
    ppuVar8 = result + 1;
    *result = *(uchar **)n1_local;
    from2_local = (uchar **)((long)from2_local + -1);
    result = ppuVar8;
    if (from2_local == (uchar **)0x0) goto LAB_002f5fe4;
  }
  if (iVar1 == 0) {
LAB_002f5e63:
    sVar5 = n0_local + 8;
    *result = *(uchar **)n0_local;
    sVar6 = n1_local + 8;
    ppuVar8 = result + 2;
    result[1] = *(uchar **)n1_local;
    sVar7 = n2_local + 8;
    result = result + 3;
    *ppuVar8 = *(uchar **)n2_local;
    from1_local = (uchar **)((long)from1_local + -1);
    from2_local = (uchar **)((long)from2_local + -1);
    _cmp12 = _cmp12 - 1;
    n2_local = sVar7;
    n1_local = sVar6;
    if (from1_local == (uchar **)0x0) {
LAB_002f5f19:
      if (from2_local == (uchar **)0x0) {
        if (_cmp12 != 0) {
          memcpy(result,(void *)n2_local,_cmp12 << 3);
        }
      }
      else if (_cmp12 == 0) {
        memcpy(result,(void *)n1_local,(long)from2_local << 3);
      }
      else {
        merge_2way_unstable((uchar **)n1_local,(size_t)from2_local,(uchar **)n2_local,_cmp12,result)
        ;
      }
      poVar3 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
      poVar3 = std::operator<<(poVar3,"~");
      poVar3 = std::operator<<(poVar3,"merge_3way_unstable");
      std::operator<<(poVar3,"\n");
      return;
    }
    n0_local = sVar5;
    if (from2_local == (uchar **)0x0) goto LAB_002f5fe4;
  }
  else {
LAB_002f5c19:
    ppuVar8 = result + 1;
    *result = *(uchar **)n0_local;
    sVar5 = n2_local + 8;
    result = result + 2;
    *ppuVar8 = *(uchar **)n2_local;
    from1_local = (uchar **)((long)from1_local + -1);
    _cmp12 = _cmp12 - 1;
    n2_local = sVar5;
    n0_local = n0_local + 8;
    if (from1_local == (uchar **)0x0) goto LAB_002f5f19;
  }
joined_r0x002f5f0d:
  if (_cmp12 == 0) {
LAB_002f60af:
    if (from1_local == (uchar **)0x0) {
      if (from2_local != (uchar **)0x0) {
        memcpy(result,(void *)n1_local,(long)from2_local << 3);
      }
    }
    else if (from2_local == (uchar **)0x0) {
      memcpy(result,(void *)n0_local,(long)from1_local << 3);
    }
    else {
      merge_2way_unstable((uchar **)n0_local,(size_t)from1_local,(uchar **)n1_local,
                          (size_t)from2_local,result);
    }
    poVar3 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
    poVar3 = std::operator<<(poVar3,"~");
    poVar3 = std::operator<<(poVar3,"merge_3way_unstable");
    std::operator<<(poVar3,"\n");
    return;
  }
  goto LAB_002f5739;
}

Assistant:

static void
merge_3way_unstable(unsigned char** restrict from0, size_t n0,
                    unsigned char** restrict from1, size_t n1,
                    unsigned char** restrict from2, size_t n2,
                    unsigned char** restrict result)
{
	debug()<<__func__<<"(), n0="<<n0<<", n1="<<n1<<", n2="<<n2<<"\n";

initial:
{
	const int cmp01 = cmp(*from0, *from1);
	const int cmp12 = cmp(*from1, *from2);
	int cmp02 = 0;
	if (cmp01 < 0) {
		if (cmp12 < 0)  { goto state0lt1lt2; }
		if (cmp12 == 0) { goto state0lt1eq2; }
		cmp02 = cmp(*from0, *from2);
		if (cmp02 < 0)  { goto state0lt2lt1; }
		if (cmp02 == 0) { goto state0eq2lt1; }
		goto state2lt0lt1;
	}
	if (cmp01 == 0) {
		if (cmp12 < 0)  { goto state0eq1lt2; }
		if (cmp12 == 0) { goto all_eq;       }
		goto state2lt0eq1;
	}
	if (cmp12 > 0)  { goto state2lt1lt0; }
	if (cmp12 == 0) { goto state1eq2lt0; }
	cmp02 = cmp(*from0, *from2);
	if (cmp02 < 0)  { goto state1lt0lt2; }
	if (cmp02 == 0) { goto state1lt0eq2; }
	goto state1lt2lt0;
}

#define StrictCase(a,b,c)                                                      \
	state##a##lt##b##lt##c:                                                \
	{                                                                      \
		*result++ = *from##a++;                                        \
		if (--n##a == 0) goto finish##a;                               \
		int cmpab = cmp(*from##a, *from##b);                           \
		if (cmpab < 0)  goto state##a##lt##b##lt##c;                   \
		if (cmpab == 0) goto state##a##eq##b##lt##c;                   \
		int cmpac = cmp(*from##a, *from##c);                           \
		if (cmpac < 0)  goto state##b##lt##a##lt##c;                   \
		if (cmpac == 0) goto state##b##lt##a##eq##c;                   \
		goto state##b##lt##c##lt##a;                                   \
	}
	StrictCase(0, 1, 2)
	StrictCase(0, 2, 1)
	StrictCase(1, 0, 2)
	StrictCase(1, 2, 0)
	StrictCase(2, 0, 1)
	StrictCase(2, 1, 0)
#undef StrictCase

#define EqLt(a,b,c)                                                            \
	static_assert(a < b, "a < b");                                         \
	state##a##eq##b##lt##c:                                                \
	{                                                                      \
		*result++ = *from ##a ++;                                      \
		*result++ = *from ##b ++;                                      \
		--n##a;                                                        \
		--n##b;                                                        \
		if (n##a == 0) goto finish ##a;                                \
		if (n##b == 0) goto finish ##b;                                \
		goto initial;                                                  \
	}
	EqLt(0, 1, 2)
	EqLt(0, 2, 1)
	EqLt(1, 2, 0)
state2eq0lt1: goto state0eq2lt1;
state1eq0lt2: goto state0eq1lt2;
state2eq1lt0: goto state1eq2lt0;
#undef EqLt

#define LtEq(a,b,c)                                                            \
	static_assert(b < c, "b < c");                                         \
	state##a##lt##b##eq##c:                                                \
	{                                                                      \
		*result++ = *from##a++;                                        \
		if (--n##a == 0) goto finish##a;                               \
		int cmpab = cmp(*from##a, *from##b);                           \
		if (cmpab < 0)  goto state##a##lt##b##eq##c;                   \
		if (cmpab == 0) goto all_eq;                                   \
		goto state##b##eq##c##lt## a;                                  \
	}
	LtEq(0, 1, 2)
	LtEq(1, 0, 2)
	LtEq(2, 0, 1)
state0lt2eq1: goto state0lt1eq2;
state1lt2eq0: goto state1lt0eq2;
state2lt1eq0: goto state2lt0eq1;
#undef LtEq

all_eq:
{
	*result++ = *from0++;
	*result++ = *from1++;
	*result++ = *from2++;
	--n0;
	--n1;
	--n2;
	if (n0==0) goto finish0;
	if (n1==0) goto finish1;
	if (n2==0) goto finish2;
	goto initial;
}

finish0:
	assert(n0 == 0);
	if (n1) {
		if (n2) {
			merge_2way_unstable(from1, n1, from2, n2, result);
		} else {
			(void) memcpy(result, from1, n1*sizeof(unsigned char*));
		}
	} else if (n2) {
		(void) memcpy(result, from2, n2*sizeof(unsigned char*));
	}
	debug()<< "~" << __func__ << "\n";
	return;
finish1:
	assert(n1 == 0);
	if (n0) {
		if (n2) {
			merge_2way_unstable(from0, n0, from2, n2, result);
		} else {
			(void) memcpy(result, from0, n0*sizeof(unsigned char*));
		}
	} else if (n2) {
		(void) memcpy(result, from2, n2*sizeof(unsigned char*));
	}
	debug()<< "~" << __func__ << "\n";
	return;
finish2:
	assert(n2 == 0);
	if (n0) {
		if (n1) {
			merge_2way_unstable(from0, n0, from1, n1, result);
		} else {
			(void) memcpy(result, from0, n0*sizeof(unsigned char*));
		}
	} else if (n1) {
		(void) memcpy(result, from1, n1*sizeof(unsigned char*));
	}
	debug()<< "~" << __func__ << "\n";
	return;
}